

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall QueryPlan::printResultSet(QueryPlan *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BatchResult *this_00;
  
  iVar1 = (*this->head_->_vptr_BaseOperator[4])();
  this_00 = (BatchResult *)CONCAT44(extraout_var,iVar1);
  while (this_00 != (BatchResult *)0x0) {
    BatchResult::~BatchResult(this_00);
    operator_delete(this_00,0x30);
    iVar1 = (*this->head_->_vptr_BaseOperator[4])();
    this_00 = (BatchResult *)CONCAT44(extraout_var_00,iVar1);
  }
  return;
}

Assistant:

void printResultSet() {
        BatchResult *rs = nullptr;
        while (true) {
            rs = head_->next();
            if (rs == nullptr)
                break;

            // rs->print();
            delete rs;
        }
    }